

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

bool __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint max_size,
          progress_callback_func_ptr pProgress_callback,void *pProgress_data,bool quick)

{
  node_vec_type *this_00;
  uint *puVar1;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *lhs;
  float fVar2;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar3;
  uint *puVar4;
  vq_node *pvVar5;
  bool bVar6;
  float fVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint i;
  ulong uVar13;
  float fVar14;
  uint local_ac;
  vector<unsigned_int> *local_a8;
  int local_9c;
  progress_callback_func_ptr local_98;
  void *local_90;
  vector<unsigned_int> *local_88;
  vector<unsigned_int> *local_80;
  vq_node root;
  vec<2U,_float> local_38;
  
  uVar9 = (this->m_training_vecs).m_size;
  if (uVar9 == 0) {
    return false;
  }
  this->m_quick = quick;
  root.m_vectors.m_p = (uint *)0x0;
  root.m_vectors.m_size = 0;
  root.m_vectors.m_capacity = 0;
  root.m_centroid.m_s[0] = 0.0;
  root.m_centroid.m_s[1] = 0.0;
  root.m_total_weight = 0;
  root.m_left = -1;
  root.m_right = -1;
  root.m_codebook_index = -1;
  root.m_unsplittable = false;
  local_98 = pProgress_callback;
  local_90 = pProgress_data;
  vector<unsigned_int>::reserve(&root.m_vectors,uVar9);
  fVar7 = 0.0;
  for (local_ac = 0; local_ac < (this->m_training_vecs).m_size; local_ac = local_ac + 1) {
    ppVar3 = (this->m_training_vecs).m_p;
    lhs = ppVar3 + local_ac;
    uVar13 = (ulong)ppVar3[local_ac].second;
    fVar14 = (float)uVar13;
    local_a8 = (vector<unsigned_int> *)CONCAT44(local_a8._4_4_,fVar14);
    operator*(&lhs->first,fVar14);
    vec<2U,_float>::operator+=(&root.m_centroid,&local_38);
    root.m_total_weight = root.m_total_weight + uVar13;
    vector<unsigned_int>::push_back(&root.m_vectors,&local_ac);
    fVar14 = (lhs->first).m_s[0];
    fVar2 = (lhs->first).m_s[1];
    fVar7 = fVar7 + (fVar2 * fVar2 + fVar14 * fVar14) * local_a8._0_4_;
  }
  root.m_variance =
       fVar7 - (root.m_centroid.m_s[1] * root.m_centroid.m_s[1] +
               root.m_centroid.m_s[0] * root.m_centroid.m_s[0]) / (float)root.m_total_weight;
  vec<2U,_float>::operator*=(&root.m_centroid,1.0 / (float)root.m_total_weight);
  this_00 = &this->m_nodes;
  vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::clear(this_00);
  vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::reserve(this_00,max_size * 2 + 1);
  vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::push_back(this_00,&root);
  vector<unsigned_int>::resize(&this->m_heap,max_size + 1,false);
  (this->m_heap).m_p[1] = 0;
  this->m_heap_size = 1;
  this->m_split_index = 0;
  local_80 = &this->m_left_children;
  local_a8 = &this->m_heap;
  vector<unsigned_int>::reserve(local_80,(this->m_training_vecs).m_size + 1);
  local_88 = &this->m_right_children;
  vector<unsigned_int>::reserve(local_88,(this->m_training_vecs).m_size + 1);
  local_9c = (max_size >> 1) + 100;
  uVar11 = 1;
  uVar13 = 0xffffffffffffffff;
LAB_0013229f:
  uVar10 = uVar11 * 100 + local_9c;
  do {
    bVar6 = this->m_heap_size == 0 || max_size <= uVar11;
    if (bVar6) {
      vector<crnlib::vec<2U,_float>_>::clear(&this->m_codebook);
      this->m_overall_variance = 0.0;
      lVar12 = 0;
      for (uVar13 = 0; uVar13 < (this->m_nodes).m_size; uVar13 = uVar13 + 1) {
        pvVar5 = this_00->m_p;
        if (*(int *)((long)(&pvVar5->m_centroid + 5) + lVar12) == -1) {
          *(uint *)((long)(&pvVar5->m_centroid + 6) + lVar12) = (this->m_codebook).m_size;
          vector<crnlib::vec<2U,_float>_>::push_back
                    (&this->m_codebook,(vec<2U,_float> *)((long)(pvVar5->m_centroid).m_s + lVar12));
          this->m_overall_variance =
               *(float *)((long)(&pvVar5->m_centroid + 2) + lVar12) + this->m_overall_variance;
        }
        lVar12 = lVar12 + 0x38;
      }
      vector<unsigned_int>::clear(local_a8);
      vector<unsigned_int>::clear(local_80);
      vector<unsigned_int>::clear(local_88);
      goto LAB_001323ac;
    }
    puVar4 = (this->m_heap).m_p;
    uVar9 = puVar4[1];
    puVar4[1] = puVar4[this->m_heap_size];
    puVar1 = &this->m_heap_size;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 != 0) {
      down_heap(this,1);
    }
    split_node(this,uVar9);
    if ((local_98 != (progress_callback_func_ptr)0x0) && ((uVar11 + 1 & 0x3f) == 0)) {
      uVar9 = (uint)((ulong)uVar10 / (ulong)max_size);
      if (uVar9 != (uint)uVar13) break;
    }
    uVar10 = uVar10 + 100;
    uVar11 = uVar11 + 1;
  } while( true );
  bVar8 = (*local_98)(uVar9,local_90);
  uVar11 = uVar11 + 1;
  uVar13 = (ulong)uVar10 / (ulong)max_size;
  if (!bVar8) {
LAB_001323ac:
    vector<unsigned_int>::~vector(&root.m_vectors);
    return bVar6;
  }
  goto LAB_0013229f;
}

Assistant:

bool generate_codebook(uint max_size, progress_callback_func_ptr pProgress_callback = nullptr, void* pProgress_data = nullptr, bool quick = false)
        {
            if (m_training_vecs.empty())
            {
                return false;
            }

            m_quick = quick;

            double ttsum = 0.0f;

            vq_node root;
            root.m_vectors.reserve(m_training_vecs.size());

            for (uint i = 0; i < m_training_vecs.size(); i++)
            {
                const VectorType& v = m_training_vecs[i].first;
                const uint weight = m_training_vecs[i].second;

                root.m_centroid += (v * (float)weight);
                root.m_total_weight += weight;
                root.m_vectors.push_back(i);

                ttsum += v.dot(v) * weight;
            }

            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));

            root.m_centroid *= (1.0f / root.m_total_weight);

            m_nodes.clear();
            m_nodes.reserve(max_size * 2 + 1);

            m_nodes.push_back(root);

            m_heap.resize(max_size + 1);
            m_heap[1] = 0;
            m_heap_size = 1;

            m_split_index = 0;

            uint total_leaves = 1;

            m_left_children.reserve(m_training_vecs.size() + 1);
            m_right_children.reserve(m_training_vecs.size() + 1);

            int prev_percentage = -1;
            while ((total_leaves < max_size) && (m_heap_size))
            {
                int worst_node_index = m_heap[1];

                m_heap[1] = m_heap[m_heap_size];
                m_heap_size--;
                if (m_heap_size)
                {
                    down_heap(1);
                }

                split_node(worst_node_index);
                total_leaves++;

                if ((pProgress_callback) && ((total_leaves & 63) == 0) && (max_size))
                {
                    int cur_percentage = (total_leaves * 100U + (max_size / 2U)) / max_size;
                    if (cur_percentage != prev_percentage)
                    {
                        if (!(*pProgress_callback)(cur_percentage, pProgress_data))
                        {
                            return false;
                        }

                        prev_percentage = cur_percentage;
                    }
                }
            }

            m_codebook.clear();

            m_overall_variance = 0.0f;

            for (uint i = 0; i < m_nodes.size(); i++)
            {
                vq_node& node = m_nodes[i];
                if (node.m_left != -1)
                {
                    CRNLIB_ASSERT(node.m_right != -1);
                    continue;
                }

                CRNLIB_ASSERT((node.m_left == -1) && (node.m_right == -1));

                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);

                m_overall_variance += node.m_variance;
            }

            m_heap.clear();
            m_left_children.clear();
            m_right_children.clear();

            return true;
        }